

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

void Timidity::mix_single_signal
               (SDWORD control_ratio,sample_t *sp,float *lp,Voice *v,float *ampat,int count)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = v->control_counter;
  if (v->control_counter != 0) goto LAB_0032bc29;
  iVar2 = update_signal(v);
  while( true ) {
    iVar3 = control_ratio;
    if (iVar2 != 0) {
      return;
    }
LAB_0032bc29:
    if (count == 0) break;
    fVar1 = *ampat;
    iVar2 = iVar3;
    if (count <= iVar3) {
      v->control_counter = iVar3 - count;
      lVar4 = 0;
      do {
        lp[lVar4 * 2] = sp[lVar4] * fVar1 + lp[lVar4 * 2];
        lVar4 = lVar4 + 1;
      } while (count != (int)lVar4);
      return;
    }
    for (; iVar2 != 0; iVar2 = iVar2 + -1) {
      *lp = *sp * fVar1 + *lp;
      lp = lp + 2;
      sp = sp + 1;
    }
    count = count - iVar3;
    iVar2 = update_signal(v);
  }
  return;
}

Assistant:

static void mix_single_signal(SDWORD control_ratio, const sample_t *sp, float *lp, Voice *v, float *ampat, int count)
{
	final_volume_t amp;
	int cc;

	if (0 == (cc = v->control_counter))
	{
		cc = control_ratio;
		if (update_signal(v))
			return;		/* Envelope ran out */
	}
	amp = *ampat;

	while (count)
	{
		if (cc < count)
		{
			count -= cc;
			while (cc--)
			{
				lp[0] += *sp++ * amp;
				lp += 2;
			}
			cc = control_ratio;
			if (update_signal(v))
				return;	/* Envelope ran out */
			amp = *ampat;
		}
		else
		{
			v->control_counter = cc - count;
			while (count--)
			{
				lp[0] += *sp++ * amp;
				lp += 2;
			}
			return;
		}
	}
}